

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  ImDrawListFlags IVar1;
  bool bVar2;
  int iVar3;
  ImDrawList *pIVar4;
  iterator pvVar5;
  value_type *p;
  char *pcVar6;
  ImVector<unsigned_short> *lhs;
  char *local_2f0;
  uint local_2cc;
  ImVec2 *local_2b0;
  uint local_2a4;
  long local_290;
  char *local_260;
  ImDrawListFlags backup_flags;
  value_type *local_238;
  ImDrawVert *v;
  int n;
  ImVec2 triangles_pos [3];
  char *buf_end;
  char *buf_p;
  char buf [300];
  uint local_c4;
  int local_c0;
  int vtx_i;
  int prim;
  undefined1 local_b0 [8];
  ImGuiListClipper clipper;
  int i;
  ImRect vtxs_rect;
  ImRect clip_rect;
  bool pcmd_node_open;
  ImDrawIdx *idx_buffer;
  ImDrawCmd *pcmd;
  ImVec2 IStack_58;
  int elem_offset;
  ImDrawList *local_50;
  ImDrawList *overlay_draw_list;
  ImVec4 local_34;
  byte local_21;
  char *pcStack_20;
  bool node_open;
  char *label_local;
  ImDrawList *draw_list_local;
  ImGuiWindow *window_local;
  
  if (draw_list->_OwnerName == (char *)0x0) {
    local_260 = "";
  }
  else {
    local_260 = draw_list->_OwnerName;
  }
  pcStack_20 = label;
  label_local = (char *)draw_list;
  draw_list_local = (ImDrawList *)window;
  local_21 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,local_260,
                      (ulong)(uint)(draw_list->VtxBuffer).Size,
                      (ulong)(uint)(draw_list->IdxBuffer).Size,(draw_list->CmdBuffer).Size);
  pcVar6 = label_local;
  pIVar4 = GetWindowDrawList();
  if ((ImDrawList *)pcVar6 == pIVar4) {
    SameLine(0.0,-1.0);
    ImColor::ImColor((ImColor *)((long)&overlay_draw_list + 4),0xff,100,100,0xff);
    local_34 = ImColor::operator_cast_to_ImVec4((ImColor *)((long)&overlay_draw_list + 4));
    TextColored(&local_34,"CURRENTLY APPENDING");
    if ((local_21 & 1) != 0) {
      TreePop();
    }
  }
  else {
    local_50 = GetOverlayDrawList();
    if ((draw_list_local != (ImDrawList *)0x0) &&
       (bVar2 = IsItemHovered(0), pIVar4 = local_50, bVar2)) {
      lhs = &draw_list_local->IdxBuffer;
      IStack_58 = ::operator+((ImVec2 *)lhs,(ImVec2 *)&(draw_list_local->IdxBuffer).Data);
      ImDrawList::AddRect(pIVar4,(ImVec2 *)lhs,&stack0xffffffffffffffa8,0xff00ffff,0.0,0xf,1.0);
    }
    if ((local_21 & 1) != 0) {
      pcmd._4_4_ = 0;
      for (idx_buffer = (ImDrawIdx *)ImVector<ImDrawCmd>::begin((ImVector<ImDrawCmd> *)label_local);
          pvVar5 = ImVector<ImDrawCmd>::end((ImVector<ImDrawCmd> *)label_local), idx_buffer < pvVar5
          ; idx_buffer = idx_buffer + 0x18) {
        if ((*(long *)(idx_buffer + 0x10) != 0) || (*(int *)idx_buffer != 0)) {
          if (*(long *)(idx_buffer + 0x10) == 0) {
            if (*(int *)(label_local + 0x10) < 1) {
              local_290 = 0;
            }
            else {
              local_290 = *(long *)(label_local + 0x18);
            }
            stack0xffffffffffffff90 = local_290;
            pvVar5 = ImVector<ImDrawCmd>::begin((ImVector<ImDrawCmd> *)label_local);
            pcVar6 = "non-indexed";
            if (0 < *(int *)(label_local + 0x10)) {
              pcVar6 = "indexed";
            }
            clip_rect.Max.x._3_1_ =
                 TreeNode((void *)(((long)idx_buffer - (long)pvVar5) / 0x30),
                          "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                          (double)*(float *)(idx_buffer + 2),(double)*(float *)(idx_buffer + 4),
                          (double)*(float *)(idx_buffer + 6),(double)*(float *)(idx_buffer + 8),
                          (ulong)*(uint *)idx_buffer,pcVar6,*(undefined8 *)(idx_buffer + 0xc));
            if (((show_draw_cmd_clip_rects & 1U) != 0) && (bVar2 = IsItemHovered(0), bVar2)) {
              ImRect::ImRect((ImRect *)&vtxs_rect.Max,(ImVec4 *)(idx_buffer + 2));
              ImRect::ImRect((ImRect *)&clipper.DisplayEnd);
              for (clipper.DisplayStart = pcmd._4_4_;
                  clipper.DisplayStart < pcmd._4_4_ + *(int *)idx_buffer;
                  clipper.DisplayStart = clipper.DisplayStart + 1) {
                if (stack0xffffffffffffff90 == 0) {
                  local_2a4 = clipper.DisplayStart;
                }
                else {
                  local_2a4 = (uint)*(ushort *)
                                     (stack0xffffffffffffff90 + (long)clipper.DisplayStart * 2);
                }
                p = ImVector<ImDrawVert>::operator[]
                              ((ImVector<ImDrawVert> *)(label_local + 0x20),local_2a4);
                ImRect::Add((ImRect *)&clipper.DisplayEnd,&p->pos);
              }
              ImRect::Floor((ImRect *)&vtxs_rect.Max);
              ImDrawList::AddRect(local_50,&vtxs_rect.Max,&clip_rect.Min,0xff00ffff,0.0,0xf,1.0);
              ImRect::Floor((ImRect *)&clipper.DisplayEnd);
              ImDrawList::AddRect(local_50,(ImVec2 *)&clipper.DisplayEnd,&vtxs_rect.Min,0xffff00ff,
                                  0.0,0xf,1.0);
            }
            if ((clip_rect.Max.x._3_1_ & 1) != 0) {
              ImGuiListClipper::ImGuiListClipper
                        ((ImGuiListClipper *)local_b0,*(uint *)idx_buffer / 3,-1.0);
              while (bVar2 = ImGuiListClipper::Step((ImGuiListClipper *)local_b0), bVar2) {
                local_c4 = pcmd._4_4_ + clipper.ItemsCount * 3;
                for (local_c0 = clipper.ItemsCount; local_c0 < clipper.StepNo;
                    local_c0 = local_c0 + 1) {
                  buf_end = (char *)&buf_p;
                  local_2b0 = (ImVec2 *)&stack0xfffffffffffffdd8;
                  do {
                    ImVec2::ImVec2(local_2b0);
                    local_2b0 = local_2b0 + 1;
                  } while (local_2b0 != triangles_pos + 2);
                  for (v._4_4_ = 0; v._4_4_ < 3; v._4_4_ = v._4_4_ + 1) {
                    if (stack0xffffffffffffff90 == 0) {
                      local_2cc = local_c4;
                    }
                    else {
                      local_2cc = (uint)*(ushort *)
                                         (stack0xffffffffffffff90 + (long)(int)local_c4 * 2);
                    }
                    local_238 = ImVector<ImDrawVert>::operator[]
                                          ((ImVector<ImDrawVert> *)(label_local + 0x20),local_2cc);
                    *(ImVec2 *)(&stack0xfffffffffffffdd8 + (long)v._4_4_ * 8) = local_238->pos;
                    if (v._4_4_ == 0) {
                      local_2f0 = "vtx";
                    }
                    else {
                      local_2f0 = "   ";
                    }
                    iVar3 = ImFormatString(buf_end,(long)(((int)buf + 0x124) - (int)buf_end),
                                           "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                           (double)(local_238->pos).x,(double)(local_238->pos).y,
                                           (double)(local_238->uv).x,(double)(local_238->uv).y,
                                           local_2f0,(ulong)local_c4,(ulong)local_238->col);
                    buf_end = buf_end + iVar3;
                    local_c4 = local_c4 + 1;
                  }
                  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffdc0,0.0,0.0);
                  Selectable((char *)&buf_p,false,0,(ImVec2 *)&stack0xfffffffffffffdc0);
                  bVar2 = IsItemHovered(0);
                  if (bVar2) {
                    IVar1 = local_50->Flags;
                    local_50->Flags = local_50->Flags & 0xfffffffe;
                    ImDrawList::AddPolyline
                              (local_50,(ImVec2 *)&stack0xfffffffffffffdd8,3,0xff00ffff,true,1.0);
                    local_50->Flags = IVar1;
                  }
                }
              }
              TreePop();
              ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)local_b0);
            }
          }
          else {
            BulletText("Callback %p, user_data %p",*(undefined8 *)(idx_buffer + 0x10),
                       *(undefined8 *)(idx_buffer + 0x14));
          }
        }
        pcmd._4_4_ = *(int *)idx_buffer + pcmd._4_4_;
      }
      TreePop();
    }
  }
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
            {
                bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
                if (draw_list == ImGui::GetWindowDrawList())
                {
                    ImGui::SameLine();
                    ImGui::TextColored(ImColor(255,100,100), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                    if (node_open) ImGui::TreePop();
                    return;
                }

                ImDrawList* overlay_draw_list = GetOverlayDrawList(); // Render additional visuals into the top-most draw list
                if (window && IsItemHovered())
                    overlay_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
                if (!node_open)
                    return;

                int elem_offset = 0;
                for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
                {
                    if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                        continue;
                    if (pcmd->UserCallback)
                    {
                        ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                        continue;
                    }
                    ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                    bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                    if (show_draw_cmd_clip_rects && ImGui::IsItemHovered())
                    {
                        ImRect clip_rect = pcmd->ClipRect;
                        ImRect vtxs_rect;
                        for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                            vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                        clip_rect.Floor(); overlay_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                        vtxs_rect.Floor(); overlay_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                    }
                    if (!pcmd_node_open)
                        continue;

                    // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                    ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                    while (clipper.Step())
                        for (int prim = clipper.DisplayStart, vtx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                        {
                            char buf[300];
                            char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                            ImVec2 triangles_pos[3];
                            for (int n = 0; n < 3; n++, vtx_i++)
                            {
                                ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[vtx_i] : vtx_i];
                                triangles_pos[n] = v.pos;
                                buf_p += ImFormatString(buf_p, (int)(buf_end - buf_p), "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n", (n == 0) ? "vtx" : "   ", vtx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                            }
                            ImGui::Selectable(buf, false);
                            if (ImGui::IsItemHovered())
                            {
                                ImDrawListFlags backup_flags = overlay_draw_list->Flags;
                                overlay_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                                overlay_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                                overlay_draw_list->Flags = backup_flags;
                            }
                        }
                    ImGui::TreePop();
                }
                ImGui::TreePop();
            }